

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::generateBufferBackedVariableAggregateTypeCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               ProgramInterface interface,ProgramResourcePropFlags targetProp,DataType dataType,
               string *nameSuffix,int depth)

{
  Variable *this;
  ResourceTestCase *this_00;
  Node *ptr;
  ArrayElement *this_01;
  SharedPtr variable;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ProgramResourceQueryTestTarget local_38;
  
  this = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(this,parentStructure,dataType);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&variable,(Node *)this);
  this_00 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget(&local_38,interface,targetProp);
  std::operator+(&local_58,"var",nameSuffix);
  ResourceTestCase::ResourceTestCase(this_00,context,&variable,&local_38,local_58._M_dataplus._M_p);
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)this_00);
  std::__cxx11::string::~string((string *)&local_58);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&variable);
  if (0 < depth) {
    ptr = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)ptr,parentStructure);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,ptr);
    std::operator+(&local_58,"_struct",nameSuffix);
    generateBufferBackedVariableAggregateTypeCases
              (context,&variable,targetGroup,interface,targetProp,dataType,&local_58,depth + -1);
    std::__cxx11::string::~string((string *)&local_58);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    this_01 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(this_01,parentStructure,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)this_01);
    std::operator+(&local_58,"_array",nameSuffix);
    generateBufferBackedVariableAggregateTypeCases
              (context,&variable,targetGroup,interface,targetProp,dataType,&local_58,depth + -1);
    std::__cxx11::string::~string((string *)&local_58);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
  }
  return;
}

Assistant:

static void generateBufferBackedVariableAggregateTypeCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, ProgramInterface interface, ProgramResourcePropFlags targetProp, glu::DataType dataType, const std::string& nameSuffix, int depth)
{
	// variable
	{
		const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(parentStructure, dataType));
		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(interface, targetProp), ("var" + nameSuffix).c_str()));
	}

	// struct
	if (depth > 0)
	{
		const ResourceDefinition::Node::SharedPtr structMember(new ResourceDefinition::StructMember(parentStructure));
		generateBufferBackedVariableAggregateTypeCases(context, structMember, targetGroup, interface, targetProp, dataType, "_struct" + nameSuffix, depth - 1);
	}

	// array
	if (depth > 0)
	{
		const ResourceDefinition::Node::SharedPtr arrayElement(new ResourceDefinition::ArrayElement(parentStructure));
		generateBufferBackedVariableAggregateTypeCases(context, arrayElement, targetGroup, interface, targetProp, dataType, "_array" + nameSuffix, depth - 1);
	}
}